

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

uint ImGui::ScaleValueFromRatioT<unsigned_int,int,float>
               (ImGuiDataType data_type,float t,uint v_min,uint v_max,bool is_logarithmic,
               float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 in_ZMM3 [64];
  
  auVar7._4_60_ = in_register_00001244;
  auVar7._0_4_ = logarithmic_zero_epsilon;
  auVar6._4_60_ = in_register_00001204;
  auVar6._0_4_ = t;
  if (v_max - v_min == 0) {
    return v_min;
  }
  auVar8 = in_ZMM3._0_16_;
  if (is_logarithmic) {
    if (t <= 0.0) {
      return v_min;
    }
    if (t < 1.0) {
      bVar3 = v_max < v_min;
      auVar1 = vcvtusi2ss_avx512f(auVar8,v_min);
      auVar1 = vmaxss_avx(auVar7._0_16_,auVar1);
      auVar8 = vcvtusi2ss_avx512f(auVar8,v_max);
      auVar8 = vmaxss_avx(auVar7._0_16_,auVar8);
      fVar4 = (float)((uint)bVar3 * auVar8._0_4_ + (uint)!bVar3 * auVar1._0_4_);
      fVar5 = powf((float)((uint)bVar3 * auVar1._0_4_ + (uint)!bVar3 * auVar8._0_4_) / fVar4,
                   (float)((uint)bVar3 * (int)(1.0 - t) + (uint)!bVar3 * (int)t));
      uVar2 = vcvttss2usi_avx512f(ZEXT416((uint)(fVar5 * fVar4)));
      return uVar2;
    }
  }
  else {
    if ((data_type & 0xfffffffeU) == 8) {
      auVar1 = vcvtusi2ss_avx512f(auVar8,v_min);
      auVar8 = vcvtusi2ss_avx512f(auVar8,v_max - v_min);
      auVar8 = vfmadd213ss_fma(auVar6._0_16_,auVar8,auVar1);
      uVar2 = vcvttss2usi_avx512f(auVar8);
      return uVar2;
    }
    if (t < 1.0) {
      return v_min + (int)((float)(int)(v_max - v_min) * t +
                          *(float *)(&DAT_00552c88 + (ulong)(v_max < v_min) * 4));
    }
  }
  return v_max;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}